

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_utils.c
# Opt level: O1

void * lrtr_calloc(size_t nmemb,size_t size)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  void *pvVar5;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((size == 0) ||
     (auVar2._8_8_ = 0, auVar2._0_8_ = size, auVar3._8_8_ = 0, auVar3._0_8_ = nmemb,
     SUB168(auVar2 * auVar3,8) == 0)) {
    __n = (size_t)((int)nmemb * (int)size);
    pvVar5 = (*MALLOC_PTR)(__n);
    if (pvVar5 != (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        pvVar5 = memset(pvVar5,0,__n);
        return pvVar5;
      }
      goto LAB_00107104;
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    pvVar5 = (void *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar5;
  }
LAB_00107104:
  __stack_chk_fail();
}

Assistant:

void *lrtr_calloc(size_t nmemb, size_t size)
{
	int bytes = 0;

#if __GNUC__ >= 5
	if (__builtin_mul_overflow(nmemb, size, &bytes)) {
		errno = ENOMEM;
		return 0;
	}
#else
	if (size && nmemb > (size_t)-1 / size) {
		errno = ENOMEM;
		return 0;
	}
	bytes = size * nmemb;
#endif
	void *p = lrtr_malloc(bytes);

	if (!p)
		return p;

	return memset(p, 0, bytes);
}